

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O2

Signal<int,_int> * __thiscall
dynamicgraph::Signal<int,_int>::operator=(Signal<int,_int> *this,int *t)

{
  int *piVar1;
  
  if (((this->keepReference == true) && (this->signalType == REFERENCE_NON_CONST)) &&
     (this->TreferenceNonConst != (int *)0x0)) {
    piVar1 = &this->Tcopy1;
    if (this->Tcopy == piVar1) {
      piVar1 = &this->Tcopy2;
      this->Tcopy2 = *t;
    }
    else {
      *piVar1 = *t;
    }
    this->copyInit = true;
    this->Tcopy = piVar1;
    *this->TreferenceNonConst = *t;
  }
  else {
    (*(this->super_SignalBase<int>)._vptr_SignalBase[0x18])(this);
  }
  return this;
}

Assistant:

Signal<T, Time> &Signal<T, Time>::operator=(const T &t) {
  if (keepReference && (REFERENCE_NON_CONST == signalType) &&
      (NULL != TreferenceNonConst)) {
    if (NULL == providerMutex) {
      setTcopy(t);
      (*TreferenceNonConst) = t;
    } else {
      try {
#ifdef HAVE_LIBBOOST_THREAD
        boost::try_mutex::scoped_try_lock lock(*providerMutex);
#endif
        setTcopy(t);
        (*TreferenceNonConst) = t;
      } catch (const MutexError &) { /* TODO ERROR */
      }
    }
  } else {
    setConstant(t);
  }
  return *this;
}